

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,false>
               (interval_t *ldata,double *rdata,interval_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  interval_t left;
  interval_t left_00;
  interval_t iVar9;
  ulong local_60;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = 0;
      do {
        iVar9.micros = *(int64_t *)((long)&ldata->micros + lVar4 * 2);
        iVar9._0_8_ = *(undefined8 *)((long)&ldata->months + lVar4 * 2);
        iVar9 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                          (iVar9,*(double *)((long)rdata + lVar4));
        *(long *)((long)&result_data->months + lVar4 * 2) = iVar9._0_8_;
        *(int64_t *)((long)&result_data->micros + lVar4 * 2) = iVar9.micros;
        lVar4 = lVar4 + 8;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = 0;
    uVar5 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar2 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar2 = count;
        }
LAB_0148948f:
        uVar3 = uVar5;
        if (uVar5 < uVar2) {
          uVar7 = uVar5 << 4 | 8;
          do {
            left.micros = *(int64_t *)((long)&ldata->months + uVar7);
            left._0_8_ = *(undefined8 *)((long)ldata + (uVar7 - 8));
            iVar9 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                              (left,rdata[uVar5]);
            *(long *)((long)result_data + (uVar7 - 8)) = iVar9._0_8_;
            *(int64_t *)((long)&result_data->months + uVar7) = iVar9.micros;
            uVar5 = uVar5 + 1;
            uVar7 = uVar7 + 0x10;
            uVar3 = uVar2;
          } while (uVar2 != uVar5);
        }
      }
      else {
        uVar7 = puVar1[local_60];
        uVar2 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar2 = count;
        }
        uVar3 = uVar2;
        if (uVar7 != 0) {
          if (uVar7 == 0xffffffffffffffff) goto LAB_0148948f;
          uVar3 = uVar5;
          if (uVar5 < uVar2) {
            uVar6 = uVar5 << 4 | 8;
            uVar8 = 0;
            do {
              if ((uVar7 >> (uVar8 & 0x3f) & 1) != 0) {
                left_00.micros = *(int64_t *)((long)&ldata->months + uVar6);
                left_00._0_8_ = *(undefined8 *)((long)ldata + (uVar6 - 8));
                iVar9 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                                  (left_00,rdata[uVar5 + uVar8]);
                *(long *)((long)result_data + (uVar6 - 8)) = iVar9._0_8_;
                *(int64_t *)((long)&result_data->months + uVar6) = iVar9.micros;
              }
              uVar8 = uVar8 + 1;
              uVar6 = uVar6 + 0x10;
              uVar3 = uVar2;
            } while (uVar2 - uVar5 != uVar8);
          }
        }
      }
      local_60 = local_60 + 1;
      uVar5 = uVar3;
    } while (local_60 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}